

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

char * el::LevelHelper::convertToString(Level level)

{
  char *pcStack_10;
  Level level_local;
  
  if (level == Global) {
    pcStack_10 = "GLOBAL";
  }
  else if (level == Debug) {
    pcStack_10 = "DEBUG";
  }
  else if (level == Info) {
    pcStack_10 = "INFO";
  }
  else if (level == Warning) {
    pcStack_10 = "WARNING";
  }
  else if (level == Error) {
    pcStack_10 = "ERROR";
  }
  else if (level == Fatal) {
    pcStack_10 = "FATAL";
  }
  else if (level == Verbose) {
    pcStack_10 = "VERBOSE";
  }
  else if (level == Trace) {
    pcStack_10 = "TRACE";
  }
  else {
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* LevelHelper::convertToString(Level level) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (level == Level::Global) return "GLOBAL";
  if (level == Level::Debug) return "DEBUG";
  if (level == Level::Info) return "INFO";
  if (level == Level::Warning) return "WARNING";
  if (level == Level::Error) return "ERROR";
  if (level == Level::Fatal) return "FATAL";
  if (level == Level::Verbose) return "VERBOSE";
  if (level == Level::Trace) return "TRACE";
  return "UNKNOWN";
}